

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case2052(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  socklen_t in_ECX;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198 [32];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_198,"struct { const x ; } ;",&local_1b9);
  Expectation::Expectation(&local_178);
  std::__cxx11::string::string
            ((string *)&local_1b8,
             (string *)&DeclarationBinder::DiagnosticsReporter::ID_of_UselessDeclaration_abi_cxx11_)
  ;
  pEVar1 = Expectation::diagnostic(&local_178,Warn,&local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  bind(this,(int)local_198,(sockaddr *)&local_c0,in_ECX);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string(local_198);
  return;
}

Assistant:

void DeclarationBinderTester::case2052()
{
    bind("struct { const x ; } ;",
         Expectation().diagnostic(
             Expectation::ErrorOrWarn::Warn,
             DeclarationBinder::DiagnosticsReporter::ID_of_UselessDeclaration));
}